

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O1

Value * __thiscall
soul::Value::fromExternalValue(soul::Type_const&,choc::value::ValueView_const&,soul::
ConstantTable&,soul::StringDictionary&)::ConversionState::convert(soul::Type_const&,choc::value::
ValueView_const__(Value *__return_storage_ptr__,void *this,Type *targetType,ValueView *source)

{
  Content *pCVar1;
  MainType MVar2;
  Object *pOVar3;
  MemberNameAndType *pMVar4;
  ComplexArray *pCVar5;
  ConstantTable *this_00;
  undefined8 uVar6;
  Allocator *pAVar7;
  uint32_t uVar8;
  int iVar9;
  Handle h;
  Structure *pSVar10;
  unsigned_long *extraout_RAX;
  unsigned_long *puVar11;
  Handle h_00;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  long lVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  char *errorMessage;
  Member *pMVar16;
  ulong uVar17;
  size_t sVar18;
  string_view sVar19;
  Value result;
  MemberNameAndValue sourceMember;
  Type elementType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  undefined1 local_300 [24];
  unsigned_long local_2e8 [4];
  undefined1 local_2c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2b8;
  uchar *local_2a8;
  StringDictionary *local_2a0;
  string *local_288;
  size_t local_280;
  ulong local_278;
  undefined1 local_270 [8];
  ValueView local_268;
  ValueView local_230;
  Type local_200;
  Structure *local_1e8;
  ulong local_1e0;
  Member *local_1d8;
  Type local_1d0;
  size_t local_1b8;
  ElementTypeAndOffset local_1b0;
  PrimitiveType local_184;
  Type local_180;
  Type local_168;
  CompileMessage local_150;
  CompileMessage local_118;
  CompileMessage local_e0;
  CompileMessage local_a8;
  Value local_70;
  
  MVar2 = (source->type).mainType;
  if (MVar2 < string) {
    if (MVar2 < int64) {
      if (MVar2 == boolean) {
        Value::Value((Value *)local_2c8,*source->data != '\0');
        castOrThrow(soul::Type_const&,soul::Value___
                  (__return_storage_ptr__,targetType,(Value *)local_2c8);
      }
      else {
        if (MVar2 != int32) goto LAB_001a5030;
        Value::Value((Value *)local_2c8,*(int32_t *)source->data);
        castOrThrow(soul::Type_const&,soul::Value___
                  (__return_storage_ptr__,targetType,(Value *)local_2c8);
      }
    }
    else if (MVar2 == int64) {
      Value::Value((Value *)local_2c8,*(int64_t *)source->data);
      castOrThrow(soul::Type_const&,soul::Value___
                (__return_storage_ptr__,targetType,(Value *)local_2c8);
    }
    else if (MVar2 == float32) {
      Value::Value((Value *)local_2c8,*(float *)source->data);
      castOrThrow(soul::Type_const&,soul::Value___
                (__return_storage_ptr__,targetType,(Value *)local_2c8);
    }
    else {
      if (MVar2 != float64) goto LAB_001a5030;
      Value::Value((Value *)local_2c8,*(double *)source->data);
      castOrThrow(soul::Type_const&,soul::Value___
                (__return_storage_ptr__,targetType,(Value *)local_2c8);
    }
LAB_001a52cc:
    ~Value((Value *)local_2c8);
  }
  else {
    if (MVar2 < primitiveArray) {
      if (MVar2 == string) {
        plVar12 = *(long **)((long)this + 8);
        sVar19 = choc::value::ValueView::getString(source);
        pCVar1 = &local_268.type.content;
        local_270 = (undefined1  [8])pCVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_270,sVar19._M_str,sVar19._M_str + sVar19._M_len);
        h.handle = (**(code **)(*plVar12 + 0x10))
                             (plVar12,CONCAT71(local_268.type._1_7_,local_268.type.mainType),
                              local_270);
        createStringLiteral((Value *)local_2c8,h);
        castOrThrow(soul::Type_const&,soul::Value___
                  (__return_storage_ptr__,targetType,(Value *)local_2c8);
        ~Value((Value *)local_2c8);
        if (local_270 == (undefined1  [8])pCVar1) {
          return __return_storage_ptr__;
        }
        operator_delete((void *)local_270,(ulong)(local_268.type.content._0_8_ + 1));
        return __return_storage_ptr__;
      }
      if (MVar2 == vector) {
        pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)targetType;
        uVar8 = choc::value::ValueView::size(source);
        if ((uVar8 == 1) && (targetType->category == primitive)) {
          choc::value::Type::getElementTypeAndOffset
                    ((ElementTypeAndOffset *)local_270,&source->type,0);
          local_2a0 = source->stringDictionary;
          local_2a8 = source->data + (long)local_268.type.allocator;
          local_2c8[0] = (Category)local_270[0];
          aStack_2b8._M_allocated_capacity = local_268.type.content._0_8_;
          aStack_2b8._8_8_ = local_268.type.content._8_8_;
          ValueView_const__(__return_storage_ptr__,this,targetType,(ValueView *)local_2c8);
          choc::value::ValueView::~ValueView((ValueView *)local_2c8);
          return __return_storage_ptr__;
        }
        if (targetType->category != vector) {
          Type::getDescription_abi_cxx11_((string *)local_2c8,targetType);
          CompileMessageHelpers::createMessage<char_const(&)[7],std::__cxx11::string>
                    (&local_a8,(CompileMessageHelpers *)0x1,none,0x2632ef,"vector",
                     (char (*) [7])local_2c8,pbVar15);
          throwError(&local_a8);
        }
        local_184.type = (targetType->primitiveType).type;
        local_288 = (string *)CONCAT44(local_288._4_4_,local_184.type);
        local_280 = (size_t)uVar8;
        Type::createVector(&local_168,&local_184,local_280);
        zeroInitialiser((Value *)local_2c8,&local_168);
        RefCountedPtr<soul::Structure>::decIfNotNull(local_168.structure.object);
        if (uVar8 != 0) {
          local_278 = CONCAT71(local_278._1_7_,(Primitive)local_288 != 0);
          sVar18 = 0;
          pbVar20 = pbVar15;
          do {
            SubElementPath::SubElementPath((SubElementPath *)local_300,sVar18);
            local_200.category = (Category)local_278;
            local_200.arrayElementCategory = invalid;
            local_200.isRef = false;
            local_200.isConstant = false;
            local_200.primitiveType.type = (Primitive)local_288;
            local_200.boundingSize = 0;
            local_200.arrayElementBoundingSize = 0;
            local_200.structure.object = (Structure *)0x0;
            choc::value::Type::getElementTypeAndOffset(&local_1b0,&source->type,(uint32_t)sVar18);
            local_230.stringDictionary = source->stringDictionary;
            local_230.data = source->data + local_1b0.offset;
            local_230.type.mainType = local_1b0.elementType.mainType;
            local_230.type.content.object = local_1b0.elementType.content.object;
            local_230.type.content._8_8_ = local_1b0.elementType.content._8_8_;
            local_230.type.allocator = local_1b0.elementType.allocator;
            ValueView_const__((Value *)local_270,this,&local_200,&local_230);
            modifySubElementInPlace
                      ((Value *)local_2c8,(SubElementPath *)local_300,(Value *)local_270);
            ~Value((Value *)local_270);
            pAVar7 = local_230.type.allocator;
            uVar6 = local_230.type.content.object;
            if ((char)local_230.type.mainType < '\0') {
              if (local_230.type.mainType == object) {
                if (local_230.type.content.object != (Object *)0x0) {
                  choc::value::Type::Object::~Object(local_230.type.content.object);
                  pbVar15 = pbVar20;
                  goto LAB_001a5298;
                }
              }
              else if ((local_230.type.mainType == complexArray) &&
                      (local_230.type.content.object != (Object *)0x0)) {
                choc::value::Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::
                ~AllocatedVector((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                                 local_230.type.content.object);
                pbVar15 = pbVar20;
LAB_001a5298:
                if (pAVar7 == (Allocator *)0x0) {
                  free((void *)uVar6);
                  pbVar20 = pbVar15;
                }
                else {
                  (**(code **)(*(long *)pAVar7 + 0x20))(pAVar7,uVar6);
                  pbVar20 = pbVar15;
                }
              }
            }
            RefCountedPtr<soul::Structure>::decIfNotNull(local_200.structure.object);
            local_300._8_8_ = 0;
            if ((Structure *)0x4 < (ulong)local_300._16_8_) {
              if ((unsigned_long *)local_300._0_8_ != (unsigned_long *)0x0) {
                operator_delete__((void *)local_300._0_8_);
              }
              local_300._0_8_ = local_2e8;
              local_300._16_8_ = (Structure *)0x4;
            }
            sVar18 = sVar18 + 1;
          } while (local_280 != sVar18);
        }
        castOrThrow(soul::Type_const&,soul::Value___
                  (__return_storage_ptr__,(Type *)pbVar15,(Value *)local_2c8);
        goto LAB_001a52cc;
      }
    }
    else {
      if ((MVar2 == primitiveArray) || (MVar2 == complexArray)) {
        pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)targetType;
        uVar8 = choc::value::ValueView::size(source);
        if (targetType->boundingSize == 0 && targetType->category == array) {
          Type::getElementType((Type *)local_270,targetType);
          Type::createArray((Type *)local_300,(Type *)local_270,(ulong)uVar8);
          ValueView_const__((Value *)local_2c8,this,(Type *)local_300,source);
          RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_300._16_8_);
          this_00 = *this;
          Value::Value(&local_70,(Value *)local_2c8);
          h_00 = ConstantTable::getHandleForValue(this_00,&local_70);
          createUnsizedArray(__return_storage_ptr__,(Type *)local_270,h_00);
          ~Value(&local_70);
          ~Value((Value *)local_2c8);
          RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_268.type.content._0_8_);
          return __return_storage_ptr__;
        }
        if ((targetType->category != array) ||
           (uVar17 = (ulong)uVar8, (long)targetType->boundingSize != uVar17)) {
          std::__cxx11::to_string((string *)local_300,uVar8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_270,"array[",(string *)local_300);
          plVar12 = (long *)std::__cxx11::string::append(local_270);
          local_2c8._0_8_ = *plVar12;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._0_8_ == paVar13) {
            aStack_2b8._M_allocated_capacity = paVar13->_M_allocated_capacity;
            aStack_2b8._8_8_ = plVar12[3];
            local_2c8._0_8_ = &aStack_2b8;
          }
          else {
            aStack_2b8._M_allocated_capacity = paVar13->_M_allocated_capacity;
          }
          local_2c8._8_8_ = plVar12[1];
          *plVar12 = (long)paVar13;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          Type::getDescription_abi_cxx11_((string *)&local_230,(Type *)pbVar15);
          CompileMessageHelpers::createMessage<std::__cxx11::string,std::__cxx11::string>
                    (&local_e0,(CompileMessageHelpers *)0x1,none,0x2632ef,local_2c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_230
                     ,pbVar15);
          throwError(&local_e0);
        }
        Type::getArrayElementType(&local_200,(Type *)pbVar15);
        Type::createArray(&local_180,&local_200,uVar17);
        zeroInitialiser((Value *)local_2c8,&local_180);
        local_288 = (string *)uVar17;
        RefCountedPtr<soul::Structure>::decIfNotNull(local_180.structure.object);
        if (uVar8 != 0) {
          sVar18 = 0;
          pbVar20 = pbVar15;
          do {
            SubElementPath::SubElementPath((SubElementPath *)local_300,sVar18);
            choc::value::Type::getElementTypeAndOffset(&local_1b0,&source->type,(uint32_t)sVar18);
            local_230.stringDictionary = source->stringDictionary;
            local_230.data = source->data + local_1b0.offset;
            local_230.type.mainType = local_1b0.elementType.mainType;
            local_230.type.content.object = local_1b0.elementType.content.object;
            local_230.type.content._8_8_ = local_1b0.elementType.content._8_8_;
            local_230.type.allocator = local_1b0.elementType.allocator;
            ValueView_const__((Value *)local_270,this,&local_200,&local_230);
            modifySubElementInPlace
                      ((Value *)local_2c8,(SubElementPath *)local_300,(Value *)local_270);
            ~Value((Value *)local_270);
            pAVar7 = local_230.type.allocator;
            uVar6 = local_230.type.content.object;
            if ((char)local_230.type.mainType < '\0') {
              if (local_230.type.mainType == object) {
                if (local_230.type.content.object != (Object *)0x0) {
                  choc::value::Type::Object::~Object(local_230.type.content.object);
                  pbVar15 = pbVar20;
                  goto LAB_001a4fe1;
                }
              }
              else if ((local_230.type.mainType == complexArray) &&
                      (local_230.type.content.object != (Object *)0x0)) {
                choc::value::Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::
                ~AllocatedVector((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                                 local_230.type.content.object);
                pbVar15 = pbVar20;
LAB_001a4fe1:
                if (pAVar7 == (Allocator *)0x0) {
                  free((void *)uVar6);
                  pbVar20 = pbVar15;
                }
                else {
                  (**(code **)(*(long *)pAVar7 + 0x20))(pAVar7,uVar6);
                  pbVar20 = pbVar15;
                }
              }
            }
            local_300._8_8_ = 0;
            if ((Structure *)0x4 < (ulong)local_300._16_8_) {
              if ((unsigned_long *)local_300._0_8_ != (unsigned_long *)0x0) {
                operator_delete__((void *)local_300._0_8_);
              }
              local_300._0_8_ = local_2e8;
              local_300._16_8_ = (Structure *)0x4;
            }
            sVar18 = sVar18 + 1;
          } while (local_288 != (string *)sVar18);
        }
        castOrThrow(soul::Type_const&,soul::Value___
                  (__return_storage_ptr__,(Type *)pbVar15,(Value *)local_2c8);
        ~Value((Value *)local_2c8);
        RefCountedPtr<soul::Structure>::decIfNotNull(local_200.structure.object);
        return __return_storage_ptr__;
      }
      if (MVar2 == object) {
        pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)targetType;
        if (targetType->category == structure) {
          pSVar10 = Type::getStructRef(targetType);
          uVar8 = choc::value::ValueView::size(source);
          local_1b8 = (pSVar10->members).numActive;
          local_280 = (size_t)uVar8;
          if (local_1b8 == local_280) {
            local_1d0.category = targetType->category;
            local_1d0.arrayElementCategory = targetType->arrayElementCategory;
            local_1d0.isRef = targetType->isRef;
            local_1d0.isConstant = targetType->isConstant;
            local_1d0.primitiveType.type = (targetType->primitiveType).type;
            local_1d0.boundingSize = targetType->boundingSize;
            local_1d0.arrayElementBoundingSize = targetType->arrayElementBoundingSize;
            local_1d0.structure.object = (targetType->structure).object;
            if (local_1d0.structure.object != (Structure *)0x0) {
              ((local_1d0.structure.object)->super_RefCountedObject).refCount =
                   ((local_1d0.structure.object)->super_RefCountedObject).refCount + 1;
            }
            zeroInitialiser(__return_storage_ptr__,&local_1d0);
            RefCountedPtr<soul::Structure>::decIfNotNull(local_1d0.structure.object);
            if ((pSVar10->members).numActive != 0) {
              uVar17 = 0;
              local_1e8 = pSVar10;
              do {
                pMVar16 = (local_1e8->members).items + uVar17;
                local_278 = uVar17;
                if (local_280 == 0) {
LAB_001a5300:
                  CompileMessageHelpers::
                  createMessage<std::__cxx11::string&,std::__cxx11::string_const&>
                            (&local_118,(CompileMessageHelpers *)0x1,none,0x263310,
                             (char *)&pMVar16->name,&local_1e8->name,pbVar15);
                  throwError(&local_118);
                }
                local_288 = &pMVar16->name;
                lVar14 = 8;
                uVar17 = 0;
                local_1e0 = 0;
                local_1d8 = pMVar16;
                do {
                  if ((source->type).mainType != object) {
                    errorMessage = "This type is not an object";
LAB_001a52fb:
                    choc::value::throwError(errorMessage);
                  }
                  pOVar3 = (source->type).content.object;
                  if ((pOVar3->members).size <= uVar17) {
                    errorMessage = "Index out of range";
                    goto LAB_001a52fb;
                  }
                  pMVar4 = (pOVar3->members).items;
                  choc::value::Type::getElementTypeAndOffset
                            ((ElementTypeAndOffset *)local_2c8,&source->type,(uint32_t)uVar17);
                  local_270 = *(undefined1 (*) [8])((long)&(pMVar4->name)._M_len + lVar14);
                  local_268.stringDictionary = source->stringDictionary;
                  local_268.data = source->data + (long)local_2a8;
                  local_268.type.mainType = local_2c8[0];
                  local_268.type.content._0_8_ = local_2c8._8_8_;
                  local_268.type.content._8_8_ = aStack_2b8._M_allocated_capacity;
                  local_268.type.allocator = (Allocator *)aStack_2b8._8_8_;
                  iVar9 = std::__cxx11::string::compare((char *)local_288);
                  if (iVar9 == 0) {
                    SubElementPath::SubElementPath((SubElementPath *)local_300,local_278);
                    ValueView_const__((Value *)local_2c8,this,&local_1d8->type,&local_268);
                    modifySubElementInPlace
                              (__return_storage_ptr__,(SubElementPath *)local_300,(Value *)local_2c8
                              );
                    ~Value((Value *)local_2c8);
                    local_300._8_8_ = 0;
                    puVar11 = extraout_RAX;
                    if ((Structure *)0x4 < (ulong)local_300._16_8_) {
                      if ((unsigned_long *)local_300._0_8_ != (unsigned_long *)0x0) {
                        operator_delete__((void *)local_300._0_8_);
                      }
                      puVar11 = local_2e8;
                      local_300._16_8_ = (Structure *)0x4;
                      local_300._0_8_ = puVar11;
                    }
                    local_1e0 = CONCAT71((int7)((ulong)puVar11 >> 8),1);
                  }
                  pAVar7 = local_268.type.allocator;
                  uVar6 = local_268.type.content._0_8_;
                  if ((char)local_268.type.mainType < '\0') {
                    if (local_268.type.mainType == 0x90) {
                      if ((Structure *)local_268.type.content._0_8_ != (Structure *)0x0) {
                        choc::value::Type::Object::~Object((Object *)local_268.type.content._0_8_);
                        goto LAB_001a4a88;
                      }
                    }
                    else if ((local_268.type.mainType == 0x80) &&
                            ((Structure *)local_268.type.content._0_8_ != (Structure *)0x0)) {
                      choc::value::Type::
                      AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::
                      ~AllocatedVector((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>
                                        *)local_268.type.content._0_8_);
LAB_001a4a88:
                      if (pAVar7 == (Allocator *)0x0) {
                        free((void *)uVar6);
                      }
                      else {
                        (**(code **)(*(long *)pAVar7 + 0x20))(pAVar7,uVar6);
                      }
                    }
                  }
                  if (iVar9 == 0) break;
                  uVar17 = uVar17 + 1;
                  lVar14 = lVar14 + 0x30;
                } while (uVar17 < local_280);
                pMVar16 = local_1d8;
                if ((local_1e0 & 1) == 0) goto LAB_001a5300;
                uVar17 = (ulong)((int)local_278 + 1);
              } while (uVar17 < (local_1e8->members).numActive);
            }
            if (local_1b8 == local_280) {
              return __return_storage_ptr__;
            }
          }
        }
        if ((source->type).mainType == object) {
          pCVar5 = (source->type).content.complexArray;
          lVar14 = *(long *)&(pCVar5->groups).size;
          local_270 = (undefined1  [8])&local_268.type.content;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_270,lVar14,
                     (long)&((pCVar5->groups).items)->repetitions + lVar14);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2c8,"struct ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_270);
          Type::getDescription_abi_cxx11_((string *)local_300,(Type *)pbVar15);
          CompileMessageHelpers::createMessage<std::__cxx11::string,std::__cxx11::string>
                    (&local_150,(CompileMessageHelpers *)0x1,none,0x2632ef,local_2c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300,
                     pbVar15);
          throwError(&local_150);
        }
        choc::value::throwError("This type is not an object");
      }
    }
LAB_001a5030:
    (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
    (__return_storage_ptr__->allocatedData).allocatedSize = 0;
    (__return_storage_ptr__->type).category = invalid;
    (__return_storage_ptr__->type).arrayElementCategory = invalid;
    (__return_storage_ptr__->type).isRef = false;
    (__return_storage_ptr__->type).isConstant = false;
    (__return_storage_ptr__->type).primitiveType = invalid;
    (__return_storage_ptr__->type).boundingSize = 0;
    (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
    (__return_storage_ptr__->allocatedData).allocatedData.items =
         (uchar *)(__return_storage_ptr__->allocatedData).allocatedData.space;
    (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
    (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
  }
  return __return_storage_ptr__;
}

Assistant:

Value convert (const Type& targetType, const choc::value::ValueView& source)
        {
            if (source.isInt32())    return castOrThrow (targetType, Value::createInt32 (source.getInt32()));
            if (source.isInt64())    return castOrThrow (targetType, Value::createInt64 (source.getInt64()));
            if (source.isFloat32())  return castOrThrow (targetType, Value (source.getFloat32()));
            if (source.isFloat64())  return castOrThrow (targetType, Value (source.getFloat64()));
            if (source.isBool())     return castOrThrow (targetType, Value (source.getBool()));
            if (source.isString())   return castOrThrow (targetType, Value::createStringLiteral (dictionary.getHandleForString (std::string (source.getString()))));

            if (source.isVector())
            {
                auto size = source.size();

                if (size == 1 && targetType.isPrimitive())
                    return convert (targetType, source[0]);

                if (! targetType.isVector())
                    throwError (Errors::cannotCastBetween ("vector", targetType.getDescription()));

                auto elementType = targetType.getVectorElementType();
                auto result = Value::zeroInitialiser (Type::createVector (elementType, size));

                for (uint32_t i = 0; i < size; ++i)
                    result.modifySubElementInPlace (i, convert (elementType, source[i]));

                return castOrThrow (targetType, std::move (result));
            }

            if (source.isArray())
            {
                auto size = source.size();

                if (targetType.isUnsizedArray())
                {
                    auto elementType = targetType.getElementType();
                    auto fixedArray = convert (elementType.createArray (size), source);
                    return Value::createUnsizedArray (elementType, constants.getHandleForValue (std::move (fixedArray)));
                }

                if (! (targetType.isArray() && size == targetType.getArraySize()))
                    throwError (Errors::cannotCastBetween ("array[" + std::to_string (size) + "]", targetType.getDescription()));

                auto elementType = targetType.getArrayElementType();
                auto result = Value::zeroInitialiser (elementType.createArray (size));

                for (uint32_t i = 0; i < size; ++i)
                    result.modifySubElementInPlace (i, convert (elementType, source[i]));

                return castOrThrow (targetType, std::move (result));
            }

            if (source.isObject())
            {
                if (targetType.isStruct())
                {
                    auto& targetStruct = targetType.getStructRef();
                    auto numMembers = source.size();

                    if (targetStruct.getMembers().size() == numMembers)
                    {
                        auto result = Value::zeroInitialiser (targetType);

                        for (uint32_t j = 0; j < targetStruct.getMembers().size(); ++j)
                        {
                            auto& m = targetStruct.getMembers()[j];
                            bool found = false;

                            for (uint32_t i = 0; i < numMembers; ++i)
                            {
                                auto sourceMember = source.getObjectMemberAt (i);

                                if (m.name == sourceMember.name)
                                {
                                    result.modifySubElementInPlace (j, convert (m.type, sourceMember.value));
                                    found = true;
                                    break;
                                }
                            }

                            if (! found)
                                throwError (Errors::unknownMemberInStruct (m.name, targetStruct.getName()));
                        }

                        return result;
                    }
                }

                throwError (Errors::cannotCastBetween ("struct " + std::string (source.getObjectClassName()),
                                                       targetType.getDescription()));
            }

            return {};
        }